

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.h
# Opt level: O2

void __thiscall CBuildVisitor::~CBuildVisitor(CBuildVisitor *this)

{
  (this->super_IVisitor)._vptr_IVisitor = (_func_int **)&PTR_Visit_0017b658;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->treesOfMethods).
              super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CFrame,_std::default_delete<const_IRT::CFrame>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CFrame,_std::default_delete<const_IRT::CFrame>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CFrame,_std::default_delete<const_IRT::CFrame>_>_>_>_>
  ::~_Rb_tree(&(this->frames)._M_t);
  std::__cxx11::string::~string((string *)&this->currentObjectClassName);
  std::__cxx11::string::~string((string *)&this->currentMethod);
  std::__cxx11::string::~string((string *)&this->currentClassName);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&this->wrapper);
  return;
}

Assistant:

CBuildVisitor( const SymbolTable *table )
            : symbolTable( table ), treesOfMethods( std::move(std::unique_ptr<MethodToIRTMap>(new MethodToIRTMap()))) {}